

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clasp_options.cpp
# Opt level: O0

Configuration * __thiscall Clasp::Cli::ClaspCliConfig::config(ClaspCliConfig *this,char *n)

{
  int iVar1;
  UserConfig *pUVar2;
  Configuration *pCVar3;
  char *in_RSI;
  ClaspConfig *in_RDI;
  char *in_stack_000002c8;
  uint8 in_stack_000002d3;
  int in_stack_000002d4;
  ClaspCliConfig *in_stack_000002d8;
  ClaspConfig *this_00;
  
  this_00 = in_RDI;
  if ((in_RSI != (char *)0x0) && (iVar1 = strcmp(in_RSI,"tester"), iVar1 == 0)) {
    pUVar2 = ClaspConfig::testerConfig(in_RDI);
    if (pUVar2 == (UserConfig *)0x0) {
      setAppOpt(in_stack_000002d8,in_stack_000002d4,in_stack_000002d3,in_stack_000002c8);
    }
    pUVar2 = ClaspConfig::testerConfig(in_RDI);
    return (Configuration *)pUVar2;
  }
  pCVar3 = ClaspConfig::config(this_00,in_RSI);
  return pCVar3;
}

Assistant:

Configuration* ClaspCliConfig::config(const char* n) {
	if (n && std::strcmp(n, "tester") == 0) {
		if (!testerConfig()) {
			setAppOpt(meta_tester, 0, "");
		}
		return testerConfig();
	}
	return ClaspConfig::config(n);
}